

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O3

int elf_uncompress_zdebug
              (backtrace_state *state,uchar *compressed,size_t compressed_size,
              uint16_t *zdebug_table,backtrace_error_callback error_callback,void *data,
              uchar **uncompressed,size_t *uncompressed_size)

{
  int iVar1;
  long lVar2;
  uchar *pout;
  int iVar3;
  ulong size;
  
  *uncompressed = (uchar *)0x0;
  *uncompressed_size = 0;
  iVar3 = 1;
  if ((0xb < compressed_size) && (*(int *)compressed == 0x42494c5a)) {
    lVar2 = 0;
    size = 0;
    do {
      size = (ulong)compressed[lVar2 + 4] | size << 8;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 8);
    pout = (uchar *)tcmalloc_backtrace_alloc(state,size,error_callback,data);
    if (pout == (uchar *)0x0) {
      iVar3 = 0;
    }
    else {
      iVar1 = elf_zlib_inflate_and_verify
                        (compressed + 0xc,compressed_size - 0xc,zdebug_table,pout,size);
      if (iVar1 != 0) {
        *uncompressed = pout;
        *uncompressed_size = size;
      }
    }
  }
  return iVar3;
}

Assistant:

static int
elf_uncompress_zdebug (struct backtrace_state *state,
		       const unsigned char *compressed, size_t compressed_size,
		       uint16_t *zdebug_table,
		       backtrace_error_callback error_callback, void *data,
		       unsigned char **uncompressed, size_t *uncompressed_size)
{
  size_t sz;
  size_t i;
  unsigned char *po;

  *uncompressed = NULL;
  *uncompressed_size = 0;

  /* The format starts with the four bytes ZLIB, followed by the 8
     byte length of the uncompressed data in big-endian order,
     followed by a zlib stream.  */

  if (compressed_size < 12 || memcmp (compressed, "ZLIB", 4) != 0)
    return 1;

  sz = 0;
  for (i = 0; i < 8; i++)
    sz = (sz << 8) | compressed[i + 4];

  if (*uncompressed != NULL && *uncompressed_size >= sz)
    po = *uncompressed;
  else
    {
      po = (unsigned char *) backtrace_alloc (state, sz, error_callback, data);
      if (po == NULL)
	return 0;
    }

  if (!elf_zlib_inflate_and_verify (compressed + 12, compressed_size - 12,
				    zdebug_table, po, sz))
    return 1;

  *uncompressed = po;
  *uncompressed_size = sz;

  return 1;
}